

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool cookie_tailmatch(char *cookie_domain,size_t cookie_domain_len,char *hostname)

{
  int iVar1;
  size_t sVar2;
  size_t hostname_len;
  char *hostname_local;
  size_t cookie_domain_len_local;
  char *cookie_domain_local;
  
  sVar2 = strlen(hostname);
  if (sVar2 < cookie_domain_len) {
    cookie_domain_local._7_1_ = false;
  }
  else {
    iVar1 = curl_strnequal(cookie_domain,hostname + (sVar2 - cookie_domain_len),cookie_domain_len);
    if (iVar1 == 0) {
      cookie_domain_local._7_1_ = false;
    }
    else if (sVar2 == cookie_domain_len) {
      cookie_domain_local._7_1_ = true;
    }
    else if (hostname[(sVar2 - 1) - cookie_domain_len] == '.') {
      cookie_domain_local._7_1_ = true;
    }
    else {
      cookie_domain_local._7_1_ = false;
    }
  }
  return cookie_domain_local._7_1_;
}

Assistant:

static bool cookie_tailmatch(const char *cookie_domain,
                             size_t cookie_domain_len,
                             const char *hostname)
{
  size_t hostname_len = strlen(hostname);

  if(hostname_len < cookie_domain_len)
    return FALSE;

  if(!strncasecompare(cookie_domain,
                      hostname + hostname_len-cookie_domain_len,
                      cookie_domain_len))
    return FALSE;

  /*
   * A lead char of cookie_domain is not '.'.
   * RFC6265 4.1.2.3. The Domain Attribute says:
   * For example, if the value of the Domain attribute is
   * "example.com", the user agent will include the cookie in the Cookie
   * header when making HTTP requests to example.com, www.example.com, and
   * www.corp.example.com.
   */
  if(hostname_len == cookie_domain_len)
    return TRUE;
  if('.' == *(hostname + hostname_len - cookie_domain_len - 1))
    return TRUE;
  return FALSE;
}